

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  void *returnvalue;
  undefined8 uVar4;
  void *returnvalue_00;
  void *returnvalue_01;
  void *returnvalue_02;
  void *returnvalue_03;
  double *pdVar5;
  long lVar6;
  int *jig;
  long lVar7;
  double *pdVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int *jr;
  long lVar12;
  double *pdVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  int retval;
  int indexB;
  double local_70;
  int ncheck;
  void *local_60;
  void *local_58;
  sunrealtype t;
  double local_48;
  double dStack_40;
  
  retval = SUNContext_Create(0,&sunctx);
  iVar9 = 1;
  iVar3 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar3 == 0) {
    returnvalue = malloc(0x9958);
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      uVar4 = SUNDlsMat_newDenseMat(6,6);
      *(undefined8 *)((long)returnvalue + lVar14 * 8) = uVar4;
      uVar4 = SUNDlsMat_newIndexArray(6);
      *(undefined8 *)((long)returnvalue + lVar14 * 8 + 0x20) = uVar4;
    }
    uVar4 = N_VNew_Serial(0x961,sunctx);
    *(undefined8 *)((long)returnvalue + 0x9928) = uVar4;
    uVar4 = N_VNew_Serial(0x961,sunctx);
    *(undefined8 *)((long)returnvalue + 0x9930) = uVar4;
    uVar4 = N_VNew_Serial(0x960,sunctx);
    *(undefined8 *)((long)returnvalue + 0x9938) = uVar4;
    uVar4 = N_VNew_Serial(0x960,sunctx);
    *(undefined8 *)((long)returnvalue + 0x9940) = uVar4;
    iVar3 = check_retval(returnvalue,"AllocUserData",2);
    if (iVar3 == 0) {
      lVar14 = (long)returnvalue + 0x130;
      *(undefined4 *)((long)returnvalue + 0x40) = 6;
      lVar7 = lVar14;
      for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
        for (lVar10 = 0; lVar10 != 0x120; lVar10 = lVar10 + 0x30) {
          *(undefined8 *)(lVar7 + lVar10) = 0;
        }
        lVar7 = lVar7 + 8;
      }
      jig = (int *)((long)returnvalue + 0x1c0);
      jr = (int *)0x3fe0000000000000;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        for (lVar6 = -0x90; lVar6 != 0; lVar6 = lVar6 + 0x30) {
          *(undefined8 *)((long)jig + lVar6 + 0x90) = 0x40c3880000000000;
          *(undefined8 *)((long)jig + lVar6 + 0x18) = 0xbea0c6f7a0b5ed8d;
        }
        *(undefined8 *)(lVar7 * 0x38 + lVar14) = 0xbff0000000000000;
        *(undefined8 *)((lVar7 + 3) * 0x38 + lVar14) = 0xbff0000000000000;
        *(undefined8 *)((long)returnvalue + lVar7 * 8 + 0x250) = 0x3ff0000000000000;
        *(undefined8 *)((long)returnvalue + lVar7 * 8 + 0x268) = 0xbff0000000000000;
        *(undefined8 *)((long)returnvalue + lVar7 * 8 + 0x280) = 0x3ff0000000000000;
        *(undefined8 *)((long)returnvalue + lVar7 * 8 + 0x298) = 0x3fe0000000000000;
        jig = jig + 2;
      }
      *(undefined4 *)((long)returnvalue + 0x44) = 0x78;
      *(undefined8 *)((long)returnvalue + 0x310) = 0x3faaf286bca1af28;
      *(undefined8 *)((long)returnvalue + 0x318) = 0x3faaf286bca1af28;
      for (lVar14 = 0x50; lVar14 != 0x56; lVar14 = lVar14 + 1) {
        dVar16 = *(double *)((long)returnvalue + lVar14 * 8) / 0.0027700831024930744;
        *(double *)((long)returnvalue + lVar14 * 8 + 0x30) = dVar16;
        *(double *)((long)returnvalue + lVar14 * 8 + 0x60) = dVar16;
      }
      *(undefined8 *)((long)returnvalue + 0x48) = 0x19000000006;
      *(undefined8 *)((long)returnvalue + 0x50) = 0x1400000014;
      *(undefined8 *)((long)returnvalue + 800) = 0x3e50000000000000;
      *(undefined8 *)((long)returnvalue + 0x58) = 0x200000004;
      *(undefined8 *)((long)returnvalue + 0x60) = 0x7800000002;
      iVar3 = (int)returnvalue;
      SetGroups(iVar3 + 0x68,iVar3 + 0x80,(int *)((long)returnvalue + 0x120),jig,
                (int *)0x3fe0000000000000);
      SetGroups(iVar3 + 0x74,iVar3 + 0xd0,(int *)((long)returnvalue + 0x128),jig,jr);
      returnvalue_00 = (void *)N_VNew_Serial(0x961,sunctx);
      lVar14 = 0;
      iVar3 = check_retval(returnvalue_00,"N_VNew_Serial",0);
      if (iVar3 == 0) {
        lVar7 = N_VGetArrayPointer(returnvalue_00);
        uVar2 = *(uint *)((long)returnvalue + 0x40);
        iVar3 = *(int *)((long)returnvalue + 0x44);
        dVar16 = *(double *)((long)returnvalue + 0x310);
        dVar1 = *(double *)((long)returnvalue + 0x318);
        uVar11 = 0;
        if (0 < (int)uVar2) {
          uVar11 = (ulong)uVar2;
        }
        lVar6 = lVar7;
        for (; lVar14 != 0x14; lVar14 = lVar14 + 1) {
          dVar17 = (double)(int)lVar14 * dVar1;
          dVar17 = dVar17 * 4.0 * (1.0 - dVar17);
          lVar10 = lVar6;
          for (lVar12 = 0; lVar12 != 0x14; lVar12 = lVar12 + 1) {
            dVar18 = (double)(int)lVar12 * dVar16;
            dVar18 = dVar18 * 4.0 * (1.0 - dVar18);
            uVar15 = 0;
            while (uVar11 != uVar15) {
              *(double *)(lVar10 + uVar15 * 8) =
                   (double)(int)(uVar15 + 1) * dVar18 * dVar18 * dVar17 * dVar17 + 10.0;
              uVar15 = uVar15 + 1;
            }
            lVar10 = lVar10 + (long)(int)uVar2 * 8;
          }
          lVar6 = lVar6 + (long)iVar3 * 8;
        }
        *(undefined8 *)(lVar7 + 0x4b00) = 0;
        puts("\nCreate and allocate CVODES memory for forward run");
        returnvalue_01 = (void *)CVodeCreate(2,sunctx);
        local_58 = returnvalue_01;
        iVar3 = check_retval(returnvalue_01,"CVodeCreate",0);
        if (iVar3 == 0) {
          *(void **)((long)returnvalue + 0x9948) = returnvalue_01;
          retval = CVodeSetUserData(returnvalue_01,returnvalue);
          iVar9 = 1;
          iVar3 = check_retval(&retval,"CVodeSetUserData",1);
          if (iVar3 == 0) {
            retval = CVodeInit(0,returnvalue_01,f,returnvalue_00);
            iVar9 = 1;
            iVar3 = check_retval(&retval,"CVodeInit",1);
            if (iVar3 == 0) {
              retval = CVodeSStolerances(0x88e368f1,0x3ee4f8b588e368f1,returnvalue_01);
              iVar9 = 1;
              iVar3 = check_retval(&retval,"CVodeSStolerances",1);
              if (iVar3 == 0) {
                iVar9 = 1;
                returnvalue_02 = (void *)SUNLinSol_SPGMR(returnvalue_00,1,0,sunctx);
                iVar3 = check_retval(returnvalue_02,"SUNLinSol_SPGMR",0);
                if (iVar3 == 0) {
                  retval = CVodeSetLinearSolver(returnvalue_01,returnvalue_02,0);
                  iVar9 = 1;
                  iVar3 = check_retval(&retval,"CVodeSetLinearSolver",1);
                  if (iVar3 == 0) {
                    retval = CVodeSetPreconditioner(returnvalue_01,Precond,PSolve);
                    iVar9 = 1;
                    iVar3 = check_retval(&retval,"CVodeSetPreconditioner",1);
                    if (iVar3 == 0) {
                      retval = CVodeSetMaxNumSteps(returnvalue_01,0x9c4);
                      iVar9 = 1;
                      iVar3 = check_retval(&retval,"CVodeSetMaxNumSteps",1);
                      if (iVar3 == 0) {
                        puts("\nAllocate global memory");
                        iVar9 = 1;
                        retval = CVodeAdjInit(returnvalue_01,300,1);
                        iVar3 = check_retval(&retval,"CVodeAdjInit",1);
                        if (iVar3 == 0) {
                          puts("\nForward integration");
                          iVar9 = 1;
                          retval = CVodeF(0,returnvalue_01,returnvalue_00,&t,1,&ncheck);
                          iVar3 = check_retval(&retval,"CVodeF",1);
                          if (iVar3 == 0) {
                            printf("\nncheck = %d\n",(ulong)(uint)ncheck);
                            lVar14 = N_VGetArrayPointer(returnvalue_00);
                            printf("\n   G = int_t int_x int_y c%d(t,x,y) dx dy dt = %f \n\n",
                                   (int)*(undefined8 *)(lVar14 + 0x4b00),6);
                            returnvalue_03 = (void *)N_VNew_Serial(0x960,sunctx);
                            iVar3 = check_retval(returnvalue_03,"N_VNew_Serial",0);
                            if (iVar3 == 0) {
                              N_VConst(0,returnvalue_03);
                              puts("\nCreate and allocate CVODES memory for backward run");
                              retval = CVodeCreateB(returnvalue_01,2,&indexB);
                              iVar9 = 1;
                              iVar3 = check_retval(&retval,"CVodeCreateB",1);
                              if (iVar3 == 0) {
                                retval = CVodeSetUserDataB(returnvalue_01,indexB,returnvalue);
                                iVar9 = 1;
                                iVar3 = check_retval(&retval,"CVodeSetUserDataB",1);
                                if (iVar3 == 0) {
                                  retval = CVodeSetMaxNumStepsB(returnvalue_01,indexB,1000);
                                  iVar9 = 1;
                                  iVar3 = check_retval(&retval,"CVodeSetMaxNumStepsB",1);
                                  if (iVar3 == 0) {
                                    retval = CVodeInitB(0,returnvalue_01,indexB,fB,returnvalue_03);
                                    iVar9 = 1;
                                    iVar3 = check_retval(&retval,"CVodeInitB",1);
                                    if (iVar3 == 0) {
                                      retval = CVodeSStolerancesB(0x88e368f1,0x3ee4f8b588e368f1,
                                                                  returnvalue_01,indexB);
                                      iVar9 = 1;
                                      iVar3 = check_retval(&retval,"CVodeSStolerancesB",1);
                                      if (iVar3 == 0) {
                                        *(int *)((long)returnvalue + 0x9950) = indexB;
                                        iVar9 = 1;
                                        local_60 = (void *)SUNLinSol_SPGMR(returnvalue_03,1,0,sunctx
                                                                          );
                                        iVar3 = check_retval(local_60,"SUNLinSol_SPGMR",0);
                                        if (iVar3 == 0) {
                                          retval = CVodeSetLinearSolverB
                                                             (returnvalue_01,indexB,local_60,0);
                                          iVar9 = 1;
                                          iVar3 = check_retval(&retval,"CVodeSetLinearSolverB",1);
                                          if (iVar3 == 0) {
                                            retval = CVodeSetPreconditionerB
                                                               (returnvalue_01,indexB,PrecondB,
                                                                PSolveB);
                                            iVar9 = 1;
                                            iVar3 = check_retval(&retval,"CVodeSetPreconditionerB",1
                                                                );
                                            if (iVar3 == 0) {
                                              puts("\nBackward integration");
                                              iVar9 = 1;
                                              retval = CVodeB(0,returnvalue_01,1);
                                              iVar3 = check_retval(&retval,"CVodeB",1);
                                              if (iVar3 == 0) {
                                                retval = CVodeGetB(returnvalue_01,indexB,&t,
                                                                   returnvalue_03);
                                                iVar9 = 1;
                                                iVar3 = check_retval(&retval,"CVodeGetB",1);
                                                if (iVar3 == 0) {
                                                  lVar14 = N_VGetArrayPointer(returnvalue_03);
                                                  pdVar13 = (double *)(lVar14 + 0x4740);
                                                  local_48 = 0.0;
                                                  dStack_40 = 0.0;
                                                  for (lVar14 = 1; lVar14 != 7; lVar14 = lVar14 + 1)
                                                  {
                                                    local_70 = 0.0;
                                                    pdVar5 = pdVar13;
                                                    for (lVar7 = 0x13; -1 < lVar7;
                                                        lVar7 = lVar7 + -1) {
                                                      pdVar8 = pdVar5;
                                                      for (lVar6 = 0; lVar6 != 0x14;
                                                          lVar6 = lVar6 + 1) {
                                                        if (local_70 < ABS(*pdVar8)) {
                                                          local_48 = *(double *)
                                                                      ((long)returnvalue + 0x310) *
                                                                     (double)(int)lVar6;
                                                          dStack_40 = *(double *)
                                                                       ((long)returnvalue + 0x318) *
                                                                      (double)(int)lVar7;
                                                          local_70 = *pdVar8;
                                                        }
                                                        pdVar8 = pdVar8 + 6;
                                                      }
                                                      pdVar5 = pdVar5 + -0x78;
                                                    }
                                                    printf(
                                                  "\nMaximum sensitivity with respect to I.C. of species %d\n"
                                                  );
                                                  printf("  lambda max = %e\n",SUB84(local_70,0));
                                                  puts("at");
                                                  printf("  x = %e\n  y = %e\n",SUB84(local_48,0),
                                                         dStack_40);
                                                  pdVar13 = pdVar13 + 1;
                                                  }
                                                  CVodeFree(&local_58);
                                                  N_VDestroy(returnvalue_00);
                                                  N_VDestroy(returnvalue_03);
                                                  SUNLinSolFree(returnvalue_02);
                                                  SUNLinSolFree(local_60);
                                                  SUNContext_Free(&sunctx);
                                                  uVar15 = 0;
                                                  uVar11 = (ulong)*(uint *)((long)returnvalue + 0x58
                                                                           );
                                                  if ((int)*(uint *)((long)returnvalue + 0x58) < 1)
                                                  {
                                                    uVar11 = uVar15;
                                                  }
                                                  for (; uVar11 != uVar15; uVar15 = uVar15 + 1) {
                                                    SUNDlsMat_destroyMat
                                                              (*(undefined8 *)
                                                                ((long)returnvalue + uVar15 * 8));
                                                    SUNDlsMat_destroyArray
                                                              (*(undefined8 *)
                                                                ((long)returnvalue +
                                                                uVar15 * 8 + 0x20));
                                                  }
                                                  N_VDestroy(*(undefined8 *)
                                                              ((long)returnvalue + 0x9928));
                                                  N_VDestroy(*(undefined8 *)
                                                              ((long)returnvalue + 0x9930));
                                                  N_VDestroy(*(undefined8 *)
                                                              ((long)returnvalue + 0x9938));
                                                  N_VDestroy(*(undefined8 *)
                                                              ((long)returnvalue + 0x9940));
                                                  free(returnvalue);
                                                  iVar9 = 0;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int main(int argc, char* argv[])
{
  sunrealtype abstol = ATOL, reltol = RTOL, t;
  N_Vector c;
  WebData wdata;
  void* cvode_mem;
  SUNLinearSolver LS, LSB;

  int retval, ncheck;

  int indexB;

  sunrealtype reltolB = RTOL, abstolB = ATOL;
  N_Vector cB;

  c         = NULL;
  cB        = NULL;
  wdata     = NULL;
  cvode_mem = NULL;
  LS = LSB = NULL;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize user data */

  wdata = AllocUserData();
  if (check_retval((void*)wdata, "AllocUserData", 2)) { return (1); }
  InitUserData(wdata);

  /* Set-up forward problem */

  /* Initializations */
  c = N_VNew_Serial(NEQ + 1, sunctx);
  if (check_retval((void*)c, "N_VNew_Serial", 0)) { return (1); }
  CInit(c, wdata);

  /* Call CVodeCreate/CVodeInit for forward run */
  printf("\nCreate and allocate CVODES memory for forward run\n");
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }
  wdata->cvode_mem = cvode_mem; /* Used in Precond */
  retval           = CVodeSetUserData(cvode_mem, wdata);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }
  retval = CVodeInit(cvode_mem, f, T0, c);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create SUNLinSol_SPGMR linear solver for forward run */
  LS = SUNLinSol_SPGMR(c, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  /* Call CVodeSetMaxNumSteps to set the maximum number of steps the
   * solver will take in an attempt to reach the next output time
   * during forward integration. */
  retval = CVodeSetMaxNumSteps(cvode_mem, 2500);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Set-up adjoint calculations */

  printf("\nAllocate global memory\n");
  retval = CVodeAdjInit(cvode_mem, NSTEPS, CV_HERMITE);
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Perform forward run */

  printf("\nForward integration\n");
  retval = CVodeF(cvode_mem, TOUT, c, &t, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  printf("\nncheck = %d\n", ncheck);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("\n   G = int_t int_x int_y c%d(t,x,y) dx dy dt = %Lf \n\n", ISPEC,
         N_VGetArrayPointer(c)[NEQ]);
#else
  printf("\n   G = int_t int_x int_y c%d(t,x,y) dx dy dt = %f \n\n", ISPEC,
         N_VGetArrayPointer(c)[NEQ]);
#endif

  /* Set-up backward problem */

  /* Allocate cB */
  cB = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)cB, "N_VNew_Serial", 0)) { return (1); }
  /* Initialize cB = 0 */
  N_VConst(ZERO, cB);

  /* Create and allocate CVODES memory for backward run */
  printf("\nCreate and allocate CVODES memory for backward run\n");
  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }
  retval = CVodeSetUserDataB(cvode_mem, indexB, wdata);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }
  retval = CVodeSetMaxNumStepsB(cvode_mem, indexB, 1000);
  if (check_retval(&retval, "CVodeSetMaxNumStepsB", 1)) { return (1); }
  retval = CVodeInitB(cvode_mem, indexB, fB, TOUT, cB);
  if (check_retval(&retval, "CVodeInitB", 1)) { return (1); }
  retval = CVodeSStolerancesB(cvode_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  wdata->indexB = indexB;

  /* Create SUNLinSol_SPGMR linear solver for backward run */
  LSB = SUNLinSol_SPGMR(cB, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LSB, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB, LSB, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditionerB(cvode_mem, indexB, PrecondB, PSolveB);
  if (check_retval(&retval, "CVodeSetPreconditionerB", 1)) { return (1); }

  /* Perform backward integration */

  printf("\nBackward integration\n");
  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &t, cB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  PrintOutput(cB, NS, MXNS, wdata);

  /* Free all memory */
  CVodeFree(&cvode_mem);

  N_VDestroy(c);
  N_VDestroy(cB);
  SUNLinSolFree(LS);
  SUNLinSolFree(LSB);
  SUNContext_Free(&sunctx);
  FreeUserData(wdata);

  return (0);
}